

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauGia.c
# Opt level: O0

int Dau_DsdToGiaCompose_rec(Gia_Man_t *pGia,word Func,int *pFanins,int nVars)

{
  int iVar;
  int iVar1;
  int iData1;
  word wVar2;
  int t1;
  int t0;
  int nVars_local;
  int *pFanins_local;
  word Func_local;
  Gia_Man_t *pGia_local;
  
  if (Func == 0) {
    pGia_local._4_4_ = 0;
  }
  else if (Func == 0xffffffffffffffff) {
    pGia_local._4_4_ = 1;
  }
  else {
    if (nVars < 1) {
      __assert_fail("nVars > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                    ,0x3d,"int Dau_DsdToGiaCompose_rec(Gia_Man_t *, word, int *, int)");
    }
    iVar = nVars + -1;
    if (iVar == 0) {
      if ((Func != s_Truths6[0]) && (Func != s_Truths6Neg[0])) {
        __assert_fail("Func == s_Truths6[0] || Func == s_Truths6Neg[0]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                      ,0x40,"int Dau_DsdToGiaCompose_rec(Gia_Man_t *, word, int *, int)");
      }
      pGia_local._4_4_ = Abc_LitNotCond(*pFanins,(uint)(Func == s_Truths6Neg[0]));
    }
    else {
      iVar1 = Abc_Tt6HasVar(Func,iVar);
      if (iVar1 == 0) {
        pGia_local._4_4_ = Dau_DsdToGiaCompose_rec(pGia,Func,pFanins,iVar);
      }
      else {
        wVar2 = Abc_Tt6Cofactor0(Func,iVar);
        iVar1 = Dau_DsdToGiaCompose_rec(pGia,wVar2,pFanins,iVar);
        wVar2 = Abc_Tt6Cofactor1(Func,iVar);
        iData1 = Dau_DsdToGiaCompose_rec(pGia,wVar2,pFanins,iVar);
        if (pGia->pMuxes == (uint *)0x0) {
          pGia_local._4_4_ = Gia_ManHashMux(pGia,pFanins[iVar],iData1,iVar1);
        }
        else {
          pGia_local._4_4_ = Gia_ManHashMuxReal(pGia,pFanins[iVar],iData1,iVar1);
        }
      }
    }
  }
  return pGia_local._4_4_;
}

Assistant:

int Dau_DsdToGiaCompose_rec( Gia_Man_t * pGia, word Func, int * pFanins, int nVars )
{
    int t0, t1;
    if ( Func == 0 )
        return 0;
    if ( Func == ~(word)0 )
        return 1;
    assert( nVars > 0 );
    if ( --nVars == 0 )
    {
        assert( Func == s_Truths6[0] || Func == s_Truths6Neg[0] );
        return Abc_LitNotCond( pFanins[0], (int)(Func == s_Truths6Neg[0]) );
    }
    if ( !Abc_Tt6HasVar(Func, nVars) )
        return Dau_DsdToGiaCompose_rec( pGia, Func, pFanins, nVars );
    t0 = Dau_DsdToGiaCompose_rec( pGia, Abc_Tt6Cofactor0(Func, nVars), pFanins, nVars );
    t1 = Dau_DsdToGiaCompose_rec( pGia, Abc_Tt6Cofactor1(Func, nVars), pFanins, nVars );
    if ( pGia->pMuxes )
        return Gia_ManHashMuxReal( pGia, pFanins[nVars], t1, t0 );
    else
        return Gia_ManHashMux( pGia, pFanins[nVars], t1, t0 );
}